

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_log_post(ma_log *pLog,ma_uint32 level,char *pMessage)

{
  char *in_RDX;
  ma_uint32 in_ESI;
  ma_log *in_RDI;
  ma_uint32 iLog;
  uint local_24;
  ma_result local_4;
  
  if ((in_RDI == (ma_log *)0x0) || (in_RDX == (char *)0x0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    ma_log_lock(in_RDI);
    for (local_24 = 0; local_24 < in_RDI->callbackCount; local_24 = local_24 + 1) {
      if (in_RDI->callbacks[local_24].onLog != (ma_log_callback_proc)0x0) {
        (*in_RDI->callbacks[local_24].onLog)(in_RDI->callbacks[local_24].pUserData,in_ESI,in_RDX);
      }
    }
    ma_log_unlock(in_RDI);
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_log_post(ma_log* pLog, ma_uint32 level, const char* pMessage)
{
    if (pLog == NULL || pMessage == NULL) {
        return MA_INVALID_ARGS;
    }

    ma_log_lock(pLog);
    {
        ma_uint32 iLog;
        for (iLog = 0; iLog < pLog->callbackCount; iLog += 1) {
            if (pLog->callbacks[iLog].onLog) {
                pLog->callbacks[iLog].onLog(pLog->callbacks[iLog].pUserData, level, pMessage);
            }
        }
    }
    ma_log_unlock(pLog);

    return MA_SUCCESS;
}